

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWOImporter::SetupProperties(LWOImporter *this,Importer *pImp)

{
  int iVar1;
  uint uVar2;
  string local_68;
  string local_48;
  
  iVar1 = Importer::GetPropertyInteger(pImp,"FAVOUR_SPEED",0);
  this->configSpeedFlag = iVar1 != 0;
  uVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_LWO_ONE_LAYER_ONLY",-1);
  this->configLayerIndex = uVar2;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  Importer::GetPropertyString(&local_48,pImp,"IMPORT_LWO_ONE_LAYER_ONLY",&local_68);
  std::__cxx11::string::_M_assign((string *)&this->configLayerName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LWOImporter::SetupProperties(const Importer* pImp)
{
    configSpeedFlag  = ( 0 != pImp->GetPropertyInteger(AI_CONFIG_FAVOUR_SPEED,0) ? true : false);
    configLayerIndex = pImp->GetPropertyInteger (AI_CONFIG_IMPORT_LWO_ONE_LAYER_ONLY,UINT_MAX);
    configLayerName  = pImp->GetPropertyString  (AI_CONFIG_IMPORT_LWO_ONE_LAYER_ONLY,"");
}